

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O2

void __thiscall
MOS::MOS6522::MOS6522<Oric::VIAPortHandler>::set_control_line_input
          (MOS6522<Oric::VIAPortHandler> *this,Port port,Line line,bool value)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  anon_struct_2_1_a83d3e1f *paVar4;
  
  if (line == Two) {
    paVar4 = (anon_struct_2_1_a83d3e1f *)
             ((this->super_MOS6522Storage).control_inputs_[port].lines + 1);
    if (paVar4->lines[0] != value) {
      bVar2 = (this->super_MOS6522Storage).registers_.peripheral_control;
      bVar3 = 0x80;
      if (port == A) {
        bVar3 = 8;
      }
      if ((bVar3 & bVar2) == 0) {
        bVar3 = 0x40;
        if (port == A) {
          bVar3 = 4;
        }
        if (((bVar3 & bVar2) == 0) != value) {
          bVar2 = 8;
          if (port == A) {
            bVar2 = 1;
          }
          puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
          *puVar1 = *puVar1 | bVar2;
          reevaluate_interrupts(this);
        }
      }
    }
  }
  else {
    if (line != One) {
      return;
    }
    paVar4 = (this->super_MOS6522Storage).control_inputs_ + port;
    if (paVar4->lines[0] != value) {
      if ((this->super_MOS6522Storage).handshake_modes_[port] == Handshake) {
        set_control_line_output(this,port,Two,On);
      }
      bVar2 = 1;
      if (port != A) {
        bVar2 = 0x10;
      }
      if (((bVar2 & (this->super_MOS6522Storage).registers_.peripheral_control) == 0) != value) {
        bVar2 = 0x10;
        if (port == A) {
          bVar2 = 2;
        }
        puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
        *puVar1 = *puVar1 | bVar2;
        reevaluate_interrupts(this);
      }
      if (port == B) {
        bVar2 = (this->super_MOS6522Storage).registers_.auxiliary_control >> 2 & 7;
        if (bVar2 == 7) {
          if (!value) {
            shift_out(this);
          }
        }
        else if ((bVar2 == 3) && (value)) {
          shift_in(this);
        }
      }
    }
  }
  paVar4->lines[0] = value;
  return;
}

Assistant:

void MOS6522<T>::set_control_line_input(Port port, Line line, bool value) {
	switch(line) {
		case Line::One:
			if(value != control_inputs_[port].lines[line]) {
				// In handshake mode, any transition on C[A/B]1 sets output high on C[A/B]2.
				if(handshake_modes_[port] == HandshakeMode::Handshake) {
					set_control_line_output(port, Line::Two, LineState::On);
				}

				// Set the proper transition interrupt bit if enabled.
				if(value == !!(registers_.peripheral_control & (port ? 0x10 : 0x01))) {
					registers_.interrupt_flags |= port ? InterruptFlag::CB1ActiveEdge : InterruptFlag::CA1ActiveEdge;
					reevaluate_interrupts();
				}

				// If this is a transition on CB1, consider updating the shift register.
				// TODO: and at least one full clock since the shift register was written?
				if(port == Port::B) {
					switch(shift_mode()) {
						default:													break;
						case ShiftMode::InUnderCB1:		if(value)	shift_in();		break;	// Shifts in are captured on a low-to-high transition.
						case ShiftMode::OutUnderCB1:	if(!value)	shift_out();	break;	// Shifts out are updated on a high-to-low transition.
					}
				}
			}
			control_inputs_[port].lines[line] = value;
		break;

		case Line::Two:
			if(	value != control_inputs_[port].lines[line] &&						// i.e. value has changed ...
				!(registers_.peripheral_control & (port ? 0x80 : 0x08)) &&			// ... and line is input ...
				value == !!(registers_.peripheral_control & (port ? 0x40 : 0x04))	// ... and it's either high or low, as required
			) {
				registers_.interrupt_flags |= port ? InterruptFlag::CB2ActiveEdge : InterruptFlag::CA2ActiveEdge;
				reevaluate_interrupts();
			}
			control_inputs_[port].lines[line] = value;
		break;
	}
}